

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.h
# Opt level: O0

cmCommand * __thiscall cmUseMangledMesaCommand::Clone(cmUseMangledMesaCommand *this)

{
  cmCommand *this_00;
  cmUseMangledMesaCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmUseMangledMesaCommand((cmUseMangledMesaCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone() { return new cmUseMangledMesaCommand; }